

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Enumerator.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,EnumeratorDeclarationSymbol *enumerator)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  
  if (enumerator != (EnumeratorDeclarationSymbol *)0x0) {
    std::operator<<(os,"<Enumerator |");
    poVar1 = std::operator<<(os," name:");
    this = &MemberDeclarationSymbol::name(&enumerator->super_MemberDeclarationSymbol)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<(os," type:");
    ty = MemberDeclarationSymbol::type(&enumerator->super_MemberDeclarationSymbol);
    operator<<(poVar1,ty);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<Enumerator is null>");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const EnumeratorDeclarationSymbol* enumerator)
{
    if (!enumerator)
        return os << "<Enumerator is null>";
    os << "<Enumerator |";
    os << " name:" << enumerator->name()->valueText();
    os << " type:" << enumerator->type();
    os << ">";
    return os;
}